

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O1

CodePrinter * __thiscall choc::text::CodePrinter::operator<<(CodePrinter *this,BlankLine *param_1)

{
  byte bVar1;
  pointer pLVar2;
  pointer pLVar3;
  size_type sVar4;
  string local_30;
  
  pLVar2 = (this->lines).
           super__Vector_base<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (this->lines).
           super__Vector_base<choc::text::CodePrinter::Line,_std::allocator<choc::text::CodePrinter::Line>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pLVar2 != pLVar3) && (sVar4 = pLVar3[-1].line._M_string_length, sVar4 != 0)) {
    do {
      bVar1 = pLVar3[-1].line._M_dataplus._M_p[sVar4 - 1];
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
        if ((pLVar2 != pLVar3) &&
           (pLVar3[-1].line._M_dataplus._M_p[pLVar3[-1].line._M_string_length - 1] != '\n')) {
          local_30.field_2._M_allocated_capacity._0_2_ = 10;
          local_30._M_string_length = 1;
          local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
          append(this,&local_30);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_30._M_dataplus._M_p != &local_30.field_2) {
            operator_delete(local_30._M_dataplus._M_p,
                            CONCAT62(local_30.field_2._M_allocated_capacity._2_6_,
                                     local_30.field_2._M_allocated_capacity._0_2_) + 1);
          }
        }
        local_30.field_2._M_allocated_capacity._0_2_ = 10;
        local_30._M_string_length = 1;
        local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
        append(this,&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p == &local_30.field_2) {
          return this;
        }
        operator_delete(local_30._M_dataplus._M_p,
                        CONCAT62(local_30.field_2._M_allocated_capacity._2_6_,
                                 local_30.field_2._M_allocated_capacity._0_2_) + 1);
        return this;
      }
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  return this;
}

Assistant:

inline CodePrinter& CodePrinter::operator<< (const BlankLine&)         { if (! isLastLineEmpty()) { if (isLastLineActive()) startNewLine(); startNewLine(); } return *this; }